

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O3

void __thiscall Assembler::printCodeBySection(Assembler *this)

{
  _Base_ptr p_Var1;
  long lVar2;
  long *plVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  char cVar6;
  char *byte;
  _Base_ptr p_Var7;
  ofstream file;
  _Rb_tree_node_base *local_238;
  long local_230;
  filebuf local_228 [8];
  undefined8 uStack_220;
  uint auStack_218 [50];
  char acStack_150 [24];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((ostream *)&local_230,(string *)&this->outputFileName,_S_app);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"Code:",5);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  cVar6 = (char)(ostream *)&local_230;
  std::ostream::put(cVar6);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  p_Var5 = (this->codeBySection)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_238 = &(this->codeBySection)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var5 != local_238) {
    do {
      if (*(_Base_ptr *)(p_Var5 + 2) != p_Var5[2]._M_parent) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_230,"section name: ",0xe);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,*(char **)(p_Var5 + 1),(long)p_Var5[1]._M_parent);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        plVar3 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
        std::ostream::put((char)plVar3);
        std::ostream::flush();
        p_Var1 = p_Var5[2]._M_parent;
        for (p_Var7 = *(_Base_ptr *)(p_Var5 + 2); p_Var7 != p_Var1;
            p_Var7 = (_Base_ptr)((long)&p_Var7->_M_color + 1)) {
          *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) =
               *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) & 0xffffffb5 | 8;
          *(undefined8 *)((long)&uStack_220 + *(long *)(local_230 + -0x18)) = 2;
          lVar2 = *(long *)(local_230 + -0x18);
          if (acStack_150[lVar2 + 1] == '\0') {
            std::ios::widen((char)&local_238 + (char)lVar2 + '\b');
            acStack_150[lVar2 + 1] = '\x01';
          }
          acStack_150[lVar2] = '0';
          poVar4 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)&local_230,(uint)(byte)(char)p_Var7->_M_color);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
        }
        *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) =
             *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) & 0xffffffb5 | 2;
        std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar6);
        std::ostream::put(cVar6);
        plVar3 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
        std::ostream::put((char)plVar3);
        std::ostream::flush();
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != local_238);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Assembler::printCodeBySection() {
    ofstream file(this->outputFileName, ios::app);

    file << "Code:" << endl << endl;

    for (auto &oneSection: codeBySection) {
        if (oneSection.second.empty()) continue;
        file << "section name: " << oneSection.first << endl << endl;

        for (const auto &byte: oneSection.second) {

            file << hex << setw(2) << setfill('0') << (((int) byte) & 0xFF) << "\t";


        }
        file << dec << endl << endl;

    }
}